

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

bool __thiscall
caffe::TransformationParameter::MergePartialFromCodedStream
          (TransformationParameter *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  void *pvVar3;
  float *pfVar4;
  uint8 *puVar5;
  ArenaStringPtr *pAVar6;
  bool bVar7;
  uint32 uVar8;
  unsigned_long uVar9;
  int64 iVar10;
  UnknownFieldSet *unknown_fields;
  char cVar11;
  uint tag;
  ulong uVar12;
  string *value;
  float fVar13;
  pair<unsigned_long,_bool> pVar14;
  float local_44;
  RepeatedField<float> *local_40;
  ArenaStringPtr *local_38;
  
  local_40 = &this->mean_value_;
  local_38 = &this->mean_file_;
LAB_003ad5df:
  pbVar2 = input->buffer_;
  uVar8 = 0;
  if (pbVar2 < input->buffer_end_) {
    bVar1 = *pbVar2;
    uVar8 = (uint32)bVar1;
    if ((char)bVar1 < '\x01') goto LAB_003ad602;
    input->buffer_ = pbVar2 + 1;
    uVar12 = (ulong)bVar1 | 0x100000000;
  }
  else {
LAB_003ad602:
    uVar8 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar8);
    uVar12 = 0;
    if (uVar8 - 1 < 0x7f) {
      uVar12 = 0x100000000;
    }
    uVar12 = uVar8 | uVar12;
  }
  pAVar6 = local_38;
  tag = (uint)uVar12;
  if ((uVar12 & 0x100000000) == 0) goto switchD_003ad672_default;
  cVar11 = (char)uVar12;
  switch((uint)(uVar12 >> 3) & 0x1fffffff) {
  case 1:
    if (cVar11 == '\r') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
      pfVar4 = (float *)input->buffer_;
      if (*(int *)&input->buffer_end_ - (int)pfVar4 < 4) {
        bVar7 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                          (input,(uint32 *)&local_44);
        fVar13 = local_44;
        if (!bVar7) {
          return false;
        }
      }
      else {
        fVar13 = *pfVar4;
        input->buffer_ = (uint8 *)(pfVar4 + 1);
      }
      this->scale_ = fVar13;
      goto LAB_003ad5df;
    }
    break;
  case 2:
    if (cVar11 == '\x10') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (uVar9 = (unsigned_long)(char)*puVar5, -1 < (long)uVar9))
      {
        input->buffer_ = puVar5 + 1;
      }
      else {
        pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        uVar9 = pVar14.first;
        if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->mirror_ = uVar9 != 0;
      goto LAB_003ad5df;
    }
    break;
  case 3:
    if (cVar11 != '\x18') break;
    *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
    pbVar2 = input->buffer_;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar8 = (uint32)bVar1;
      if ((char)bVar1 < '\0') goto LAB_003ad85f;
      this->crop_size_ = (uint)bVar1;
      input->buffer_ = pbVar2 + 1;
    }
    else {
      uVar8 = 0;
LAB_003ad85f:
      iVar10 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar8);
      this->crop_size_ = (uint32)iVar10;
      if (iVar10 < 0) {
        return false;
      }
    }
    goto LAB_003ad5df;
  case 4:
    if (cVar11 == '\"') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      value = (this->mean_file_).ptr_;
      if (value == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                  (local_38,(string *)
                            &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        value = pAVar6->ptr_;
      }
      bVar7 = google::protobuf::internal::WireFormatLite::ReadBytes(input,value);
      if (!bVar7) {
        return false;
      }
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                ((local_38->ptr_->_M_dataplus)._M_p,(int)local_38->ptr_->_M_string_length,PARSE,
                 "caffe.TransformationParameter.mean_file");
      goto LAB_003ad5df;
    }
    break;
  case 5:
    if (cVar11 == '*') {
      bVar7 = google::protobuf::internal::WireFormatLite::
              ReadPackedPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                        (input,local_40);
    }
    else {
      if ((tag & 0xff) != 0x2d) break;
      bVar7 = google::protobuf::internal::WireFormatLite::
              ReadRepeatedPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                        (1,0x2d,input,local_40);
    }
    goto LAB_003ad656;
  case 6:
    if (cVar11 == '0') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (uVar9 = (unsigned_long)(char)*puVar5, -1 < (long)uVar9))
      {
        input->buffer_ = puVar5 + 1;
      }
      else {
        pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        uVar9 = pVar14.first;
        if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->force_color_ = uVar9 != 0;
      goto LAB_003ad5df;
    }
    break;
  case 7:
    if (cVar11 == '8') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (uVar9 = (unsigned_long)(char)*puVar5, -1 < (long)uVar9))
      {
        input->buffer_ = puVar5 + 1;
      }
      else {
        pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        uVar9 = pVar14.first;
        if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->force_gray_ = uVar9 != 0;
      goto LAB_003ad5df;
    }
  }
switchD_003ad672_default:
  if (tag == 0) {
    return true;
  }
  if ((tag & 7) == 4) {
    return true;
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) == 0) {
    unknown_fields =
         google::protobuf::internal::
         InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
         ::mutable_unknown_fields_slow
                   (&(this->_internal_metadata_).
                     super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   );
  }
  else {
    unknown_fields = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
  }
  bVar7 = google::protobuf::internal::WireFormat::SkipField(input,tag,unknown_fields);
LAB_003ad656:
  if (bVar7 == false) {
    return false;
  }
  goto LAB_003ad5df;
}

Assistant:

bool TransformationParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.TransformationParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional float scale = 1 [default = 1];
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(13u)) {
          set_has_scale();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &scale_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool mirror = 2 [default = false];
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_mirror();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &mirror_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 crop_size = 3 [default = 0];
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          set_has_crop_size();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &crop_size_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string mean_file = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_mean_file()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->mean_file().data(), this->mean_file().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.TransformationParameter.mean_file");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated float mean_value = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(45u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 1, 45u, input, this->mutable_mean_value())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(42u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitiveNoInline<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, this->mutable_mean_value())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool force_color = 6 [default = false];
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(48u)) {
          set_has_force_color();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &force_color_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool force_gray = 7 [default = false];
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(56u)) {
          set_has_force_gray();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &force_gray_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.TransformationParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.TransformationParameter)
  return false;
#undef DO_
}